

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O1

void intgemm::kernel_upcast16to32_test<(intgemm::CPUType)4>(void)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  AlignedVector<int> output;
  AlignedVector<short> input;
  AssertionHandler catchAssertionHandler;
  int local_134;
  AlignedVector<int> local_130;
  AlignedVector<short> local_120;
  long local_110;
  SourceLineInfo local_108;
  ITransientExpression local_f8;
  undefined1 *local_e8;
  char *local_e0;
  size_t sStack_d8;
  int *local_d0;
  StringRef local_c8;
  undefined1 local_b8 [64];
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<short>::AlignedVector(&local_120,0x20,0x40);
    AlignedVector<int>::AlignedVector(&local_130,0x20,0x40);
    if (local_120.size_ != 0) {
      auVar7 = vpbroadcastq_avx512f();
      auVar8 = vpmovsxbw_avx512bw(_DAT_001ba3e0);
      lVar6 = 0;
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar10 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar13 = vpbroadcastw_avx512bw(ZEXT216(0x20));
      do {
        auVar14 = vpbroadcastq_avx512f();
        auVar15 = vporq_avx512f(auVar14,auVar9);
        auVar16 = vporq_avx512f(auVar14,auVar10);
        auVar17 = vporq_avx512f(auVar14,auVar11);
        auVar14 = vporq_avx512f(auVar14,auVar12);
        vpcmpuq_avx512f(auVar14,auVar7,2);
        vpcmpuq_avx512f(auVar17,auVar7,2);
        vpcmpuq_avx512f(auVar16,auVar7,2);
        vpcmpuq_avx512f(auVar15,auVar7,2);
        auVar14 = vmovdqu16_avx512bw(auVar8);
        *(undefined1 (*) [64])((undefined1 *)local_120.mem_ + lVar6 * 2) = auVar14;
        lVar6 = lVar6 + 0x20;
        auVar8 = vpaddw_avx512bw(auVar8,auVar13);
      } while (((local_120.size_ + 0x7fffffffffffffff & 0x7fffffffffffffff) -
               (ulong)((uint)(local_120.size_ + 0x7fffffffffffffff) & 0x1f)) + 0x20 != lVar6);
    }
    auVar7 = vmovdqa64_avx512f(*(undefined1 (*) [64])local_120.mem_);
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_b8 = vmovdqu64_avx512f(auVar7);
      kernel_upcast16to32_test<(intgemm::CPUType)4>();
      auVar7 = vmovdqu64_avx512f(local_b8);
    }
    if (kernels::upcast16to32(long_long(int))::vmax_negative == '\0') {
      local_b8 = vmovdqu64_avx512f(auVar7);
      kernel_upcast16to32_test<(intgemm::CPUType)4>();
      auVar7 = vmovdqu64_avx512f(local_b8);
    }
    if (kernels::upcast16to32(long_long(int))::permutation_indices == '\0') {
      local_b8 = vmovdqu64_avx512f(auVar7);
      kernel_upcast16to32_test<(intgemm::CPUType)4>();
      auVar7 = vmovdqu64_avx512f(local_b8);
    }
    auVar8 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::permutation_indices);
    auVar7 = vpermq_avx512f(auVar8,auVar7);
    auVar8 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::vzero);
    uVar5 = vpcmpgtw_avx512bw(auVar8,auVar7);
    auVar9 = vmovdqu16_avx512bw(kernels::upcast16to32(long_long(int))::vmax_negative);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar10._0_2_ = (ushort)bVar3 * auVar9._0_2_ | (ushort)!bVar3 * auVar8._0_2_;
    bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar10._2_2_ = (ushort)bVar3 * auVar9._2_2_ | (ushort)!bVar3 * auVar8._2_2_;
    bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar10._4_2_ = (ushort)bVar3 * auVar9._4_2_ | (ushort)!bVar3 * auVar8._4_2_;
    bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar10._6_2_ = (ushort)bVar3 * auVar9._6_2_ | (ushort)!bVar3 * auVar8._6_2_;
    bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar10._8_2_ = (ushort)bVar3 * auVar9._8_2_ | (ushort)!bVar3 * auVar8._8_2_;
    bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar10._10_2_ = (ushort)bVar3 * auVar9._10_2_ | (ushort)!bVar3 * auVar8._10_2_;
    bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar10._12_2_ = (ushort)bVar3 * auVar9._12_2_ | (ushort)!bVar3 * auVar8._12_2_;
    bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
    auVar10._14_2_ = (ushort)bVar3 * auVar9._14_2_ | (ushort)!bVar3 * auVar8._14_2_;
    bVar3 = (bool)((byte)(uVar5 >> 8) & 1);
    auVar10._16_2_ = (ushort)bVar3 * auVar9._16_2_ | (ushort)!bVar3 * auVar8._16_2_;
    bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
    auVar10._18_2_ = (ushort)bVar3 * auVar9._18_2_ | (ushort)!bVar3 * auVar8._18_2_;
    bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
    auVar10._20_2_ = (ushort)bVar3 * auVar9._20_2_ | (ushort)!bVar3 * auVar8._20_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
    auVar10._22_2_ = (ushort)bVar3 * auVar9._22_2_ | (ushort)!bVar3 * auVar8._22_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
    auVar10._24_2_ = (ushort)bVar3 * auVar9._24_2_ | (ushort)!bVar3 * auVar8._24_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
    auVar10._26_2_ = (ushort)bVar3 * auVar9._26_2_ | (ushort)!bVar3 * auVar8._26_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
    auVar10._28_2_ = (ushort)bVar3 * auVar9._28_2_ | (ushort)!bVar3 * auVar8._28_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0xf) & 1);
    auVar10._30_2_ = (ushort)bVar3 * auVar9._30_2_ | (ushort)!bVar3 * auVar8._30_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x10) & 1);
    auVar10._32_2_ = (ushort)bVar3 * auVar9._32_2_ | (ushort)!bVar3 * auVar8._32_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x11) & 1);
    auVar10._34_2_ = (ushort)bVar3 * auVar9._34_2_ | (ushort)!bVar3 * auVar8._34_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x12) & 1);
    auVar10._36_2_ = (ushort)bVar3 * auVar9._36_2_ | (ushort)!bVar3 * auVar8._36_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x13) & 1);
    auVar10._38_2_ = (ushort)bVar3 * auVar9._38_2_ | (ushort)!bVar3 * auVar8._38_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x14) & 1);
    auVar10._40_2_ = (ushort)bVar3 * auVar9._40_2_ | (ushort)!bVar3 * auVar8._40_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x15) & 1);
    auVar10._42_2_ = (ushort)bVar3 * auVar9._42_2_ | (ushort)!bVar3 * auVar8._42_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x16) & 1);
    auVar10._44_2_ = (ushort)bVar3 * auVar9._44_2_ | (ushort)!bVar3 * auVar8._44_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x17) & 1);
    auVar10._46_2_ = (ushort)bVar3 * auVar9._46_2_ | (ushort)!bVar3 * auVar8._46_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x18) & 1);
    auVar10._48_2_ = (ushort)bVar3 * auVar9._48_2_ | (ushort)!bVar3 * auVar8._48_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x19) & 1);
    auVar10._50_2_ = (ushort)bVar3 * auVar9._50_2_ | (ushort)!bVar3 * auVar8._50_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x1a) & 1);
    auVar10._52_2_ = (ushort)bVar3 * auVar9._52_2_ | (ushort)!bVar3 * auVar8._52_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x1b) & 1);
    auVar10._54_2_ = (ushort)bVar3 * auVar9._54_2_ | (ushort)!bVar3 * auVar8._54_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x1c) & 1);
    auVar10._56_2_ = (ushort)bVar3 * auVar9._56_2_ | (ushort)!bVar3 * auVar8._56_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x1d) & 1);
    auVar10._58_2_ = (ushort)bVar3 * auVar9._58_2_ | (ushort)!bVar3 * auVar8._58_2_;
    bVar3 = (bool)((byte)(uVar5 >> 0x1e) & 1);
    auVar10._60_2_ = (ushort)bVar3 * auVar9._60_2_ | (ushort)!bVar3 * auVar8._60_2_;
    bVar3 = SUB81(uVar5 >> 0x1f,0);
    auVar10._62_2_ = (ushort)bVar3 * auVar9._62_2_ | (ushort)!bVar3 * auVar8._62_2_;
    auVar8 = vpunpcklwd_avx512bw(auVar7,auVar10);
    auVar9 = vpunpckhwd_avx512bw(auVar7,auVar10);
    auVar7 = vmovdqa64_avx512f(auVar8);
    *(undefined1 (*) [64])local_130.mem_ = auVar7;
    auVar7 = vmovdqa64_avx512f(auVar9);
    *(undefined1 (*) [64])((long)local_130.mem_ + 0x40) = auVar7;
    if (local_130.size_ != 0) {
      lVar6 = 0;
      auVar7._56_8_ = 0;
      auVar7._0_56_ = local_b8._8_56_;
      local_b8 = auVar7 << 0x40;
      do {
        local_f8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_f8.m_isBinaryExpression = true;
        local_f8.m_result = false;
        local_f8._10_6_ = 0;
        local_108.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
        ;
        local_108.line = 0x40;
        Catch::StringRef::StringRef(&local_c8,"output[i] == int32_t(input[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_f8,&local_108,local_c8,ContinueOnFailure);
        sVar1 = *(short *)((undefined1 *)local_120.mem_ + local_b8._0_8_ * 2);
        iVar2 = *(int *)((undefined1 *)local_130.mem_ + lVar6);
        puVar4 = (undefined1 *)local_130.mem_;
        local_134 = (int)sVar1;
        local_110 = lVar6;
        Catch::StringRef::StringRef((StringRef *)&local_108,"==");
        local_f8.m_result = iVar2 == sVar1;
        local_f8.m_isBinaryExpression = true;
        local_f8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed958;
        local_e0 = local_108.file;
        sStack_d8 = local_108.line;
        local_d0 = &local_134;
        local_e8 = puVar4 + lVar6;
        Catch::AssertionHandler::handleExpr(&local_78,&local_f8);
        Catch::ITransientExpression::~ITransientExpression(&local_f8);
        Catch::AssertionHandler::complete(&local_78);
        lVar6 = local_110;
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        uVar5 = local_b8._0_8_ + 1;
        lVar6 = lVar6 + 4;
        local_b8._0_8_ = uVar5;
      } while (uVar5 < local_130.size_);
    }
    free(local_130.mem_);
    free(local_120.mem_);
  }
  return;
}

Assistant:

void kernel_upcast16to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int16_t);

  AlignedVector<int16_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int16_t>(-LENGTH / 2));

  auto result = kernels::upcast16to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}